

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfileio.c
# Opt level: O0

int fits_already_open(fitsfile **fptr,char *url,char *urltype,char *infile,char *extspec,
                     char *rowfilter,char *binspec,char *colspec,int mode,int noextsyn,int *isopen,
                     int *status)

{
  FITSfile *pFVar1;
  int iVar2;
  size_t sVar3;
  fitsfile *pfVar4;
  char local_24f8 [8];
  char tmpinfile [1025];
  char tmpStr [1025];
  char cwd [1025];
  char local_18c8 [8];
  char oldcolspec [1025];
  char local_14b8 [8];
  char oldbinspec [1025];
  char local_10a8 [8];
  char oldrowfilter [1025];
  char local_c98 [8];
  char oldoutfile [1025];
  char local_888 [8];
  char oldextspec [1025];
  char local_478 [8];
  char oldinfile [1025];
  char local_68 [8];
  char oldurltype [20];
  int local_4c;
  int iMatch;
  int ii;
  FITSfile *oldFptr;
  char *rowfilter_local;
  char *extspec_local;
  char *infile_local;
  char *urltype_local;
  char *url_local;
  fitsfile **fptr_local;
  
  oldurltype[0x10] = -1;
  oldurltype[0x11] = -1;
  oldurltype[0x12] = -1;
  oldurltype[0x13] = -1;
  *isopen = 0;
  if (mode == 0) {
    fptr_local._4_4_ = *status;
  }
  else {
    strcpy(local_24f8,infile);
    iVar2 = fits_strcasecmp(urltype,"FILE://");
    if ((iVar2 == 0) && (iVar2 = standardize_path(local_24f8,status), iVar2 != 0)) {
      fptr_local._4_4_ = *status;
    }
    else {
      for (local_4c = 0; local_4c < 10000; local_4c = local_4c + 1) {
        if (FptrTable[local_4c] != (FITSfile *)0x0) {
          pFVar1 = FptrTable[local_4c];
          if (pFVar1->noextsyntax == 0) {
            ffiurl(pFVar1->filename,local_68,local_478,local_c98,local_888,local_10a8,local_14b8,
                   local_18c8,status);
            if (0 < *status) {
              ffpmsg("could not parse the previously opened filename: (ffopen)");
              ffpmsg(pFVar1->filename);
              return *status;
            }
            iVar2 = fits_strcasecmp(local_68,"FILE://");
            if ((iVar2 == 0) && (iVar2 = standardize_path(local_478,status), iVar2 != 0)) {
              return *status;
            }
            iVar2 = strcmp(urltype,local_68);
            if (((iVar2 == 0) && (iVar2 = strcmp(local_24f8,local_478), iVar2 == 0)) &&
               ((((*rowfilter == '\0' &&
                  (((local_10a8[0] == '\0' && (*binspec == '\0')) && (local_14b8[0] == '\0')))) &&
                 ((*colspec == '\0' && (local_18c8[0] == '\0')))) ||
                ((iVar2 = strcmp(rowfilter,local_10a8), iVar2 == 0 &&
                 (((iVar2 = strcmp(binspec,local_14b8), iVar2 == 0 &&
                   (iVar2 = strcmp(colspec,local_18c8), iVar2 == 0)) &&
                  (iVar2 = strcmp(extspec,local_888), iVar2 == 0)))))))) {
              if ((mode == 1) && (pFVar1->writemode == 0)) {
                ffpmsg("cannot reopen file READWRITE when previously opened READONLY");
                ffpmsg(url);
                *status = 0x68;
                return 0x68;
              }
              oldurltype[0x10] = (undefined1)local_4c;
              oldurltype[0x11] = local_4c._1_1_;
              oldurltype[0x12] = local_4c._2_1_;
              oldurltype[0x13] = local_4c._3_1_;
            }
          }
          else {
            iVar2 = fits_strcasecmp(urltype,"FILE://");
            if (iVar2 == 0) {
              sVar3 = strlen(pFVar1->filename);
              if (0x400 < sVar3) {
                ffpmsg("Name of old file is too long. (fits_already_open)");
                *status = 0x68;
                return 0x68;
              }
              strcpy(local_478,pFVar1->filename);
              iVar2 = standardize_path(local_478,status);
              if (iVar2 != 0) {
                return *status;
              }
              iVar2 = strcmp(local_24f8,local_478);
              if ((iVar2 == 0) &&
                 ((noextsyn != 0 ||
                  (((*rowfilter == '\0' && (*binspec == '\0')) && (*colspec == '\0')))))) {
                if ((mode == 1) && (pFVar1->writemode == 0)) {
                  ffpmsg("cannot reopen file READWRITE when previously opened READONLY");
                  ffpmsg(url);
                  *status = 0x68;
                  return 0x68;
                }
                oldurltype[0x10] = (undefined1)local_4c;
                oldurltype[0x11] = local_4c._1_1_;
                oldurltype[0x12] = local_4c._2_1_;
                oldurltype[0x13] = local_4c._3_1_;
              }
            }
          }
        }
      }
      if (-1 < (int)oldurltype._16_4_) {
        pFVar1 = FptrTable[(int)oldurltype._16_4_];
        pfVar4 = (fitsfile *)calloc(1,0x10);
        *fptr = pfVar4;
        if (*fptr == (fitsfile *)0x0) {
          ffpmsg("failed to allocate structure for following file: (ffopen)");
          ffpmsg(url);
          *status = 0x71;
          return 0x71;
        }
        (*fptr)->Fptr = pFVar1;
        (*fptr)->HDUposition = 0;
        (*fptr)->Fptr->open_count = (*fptr)->Fptr->open_count + 1;
        if (*binspec != '\0') {
          *extspec = '\0';
        }
        *rowfilter = '\0';
        *binspec = '\0';
        *colspec = '\0';
        *isopen = 1;
      }
      fptr_local._4_4_ = *status;
    }
  }
  return fptr_local._4_4_;
}

Assistant:

int fits_already_open(fitsfile **fptr, /* I/O - FITS file pointer       */ 
           char *url, 
           char *urltype, 
           char *infile, 
           char *extspec, 
           char *rowfilter,
           char *binspec, 
           char *colspec, 
           int  mode,             /* I - 0 = open readonly; 1 = read/write   */
           int  noextsyn, /* I - 0 = ext syntax may be used; 1 = ext syntax disabled */
           int  *isopen,          /* O - 1 = file is already open            */
           int  *status)          /* IO - error status                       */
/*
  Check if the file to be opened is already open.  If so, then attach to it.
*/

   /* the input strings must not exceed the standard lengths */
   /* of FLEN_FILENAME, MAX_PREFIX_LEN, etc. */

     /*
       this function was changed so that for files of access method FILE://
       the file paths are compared using standard URL syntax and absolute
       paths (as opposed to relative paths). This eliminates some instances
       where a file is already opened but it is not realized because it
       was opened with another file path. For instance, if the CWD is
       /a/b/c and I open /a/b/c/foo.fits then open ./foo.fits the previous
       version of this function would not have reconized that the two files
       were the same. This version does recognize that the two files are
       the same.
     */
{
    FITSfile *oldFptr;
    int ii, iMatch=-1;
    char oldurltype[MAX_PREFIX_LEN], oldinfile[FLEN_FILENAME];
    char oldextspec[FLEN_FILENAME], oldoutfile[FLEN_FILENAME];
    char oldrowfilter[FLEN_FILENAME];
    char oldbinspec[FLEN_FILENAME], oldcolspec[FLEN_FILENAME];
    char cwd[FLEN_FILENAME];
    char tmpStr[FLEN_FILENAME];
    char tmpinfile[FLEN_FILENAME]; 
    
    *isopen = 0;

/*  When opening a file with readonly access then we simply let
    the operating system open the file again, instead of using the CFITSIO
    trick of attaching to the previously opened file.  This is required
    if CFITSIO is running in a multi-threaded environment, because 2 different
    threads cannot share the same FITSfile pointer.
    
    If the file is opened/reopened with write access, then the file MUST
    only be physically opened once..
*/ 
    if (mode == 0)
        return(*status);

    strcpy(tmpinfile, infile);
    if(fits_strcasecmp(urltype,"FILE://") == 0)
    {
       if (standardize_path(tmpinfile, status))
          return(*status);          
    }

    for (ii = 0; ii < NMAXFILES; ii++)   /* check every buffer */
    {
        if (FptrTable[ii] != 0)
        {
          oldFptr = FptrTable[ii];
          
          if (oldFptr->noextsyntax)
          {
            /* old urltype must be "file://" */
            if (fits_strcasecmp(urltype,"FILE://") == 0)
            {
               /* compare tmpinfile to adjusted oldFptr->filename */
               
               /* This shouldn't be possible, but check anyway */
               if (strlen(oldFptr->filename) > FLEN_FILENAME-1)        
               {
                  ffpmsg("Name of old file is too long. (fits_already_open)");
                  return (*status = FILE_NOT_OPENED);
               }
               strcpy(oldinfile, oldFptr->filename);
               if (standardize_path(oldinfile, status))
                  return(*status);
                              
               if (!strcmp(tmpinfile, oldinfile))
               {
                  /* if infile is not noextsyn, must check that it is not
                     using filters of any kind */
                  if (noextsyn || (!rowfilter[0] && !binspec[0] && !colspec[0])) 
                  {
                     if (mode == READWRITE && oldFptr->writemode == READONLY)
                     {
                       /*
                         cannot assume that a file previously opened with READONLY
                         can now be written to (e.g., files on CDROM, or over the
                         the network, or STDIN), so return with an error.
                       */

                       ffpmsg(
                   "cannot reopen file READWRITE when previously opened READONLY");
                       ffpmsg(url);
                       return(*status = FILE_NOT_OPENED);
                     }
                     iMatch = ii;
                  }  
               }
             }            
          } /* end if old file has disabled extended syntax */
          else
          {
             fits_parse_input_url(oldFptr->filename, oldurltype, 
                       oldinfile, oldoutfile, oldextspec, oldrowfilter, 
                       oldbinspec, oldcolspec, status);

             if (*status > 0)
             {
               ffpmsg("could not parse the previously opened filename: (ffopen)");
               ffpmsg(oldFptr->filename);
               return(*status);
             }
             
             if(fits_strcasecmp(oldurltype,"FILE://") == 0)
               {
                 if (standardize_path(oldinfile, status))
                    return(*status);
               }

             if (!strcmp(urltype, oldurltype) && !strcmp(tmpinfile, oldinfile) )
             {
                 /* identical type of file and root file name */

                 if ( (!rowfilter[0] && !oldrowfilter[0] &&
                       !binspec[0]   && !oldbinspec[0] &&
                       !colspec[0]   && !oldcolspec[0])

                     /* no filtering or binning specs for either file, so */
                     /* this is a case where the same file is being reopened. */
                     /* It doesn't matter if the extensions are different */

                         ||   /* or */

                     (!strcmp(rowfilter, oldrowfilter) &&
                      !strcmp(binspec, oldbinspec)     &&
                      !strcmp(colspec, oldcolspec)     &&
                      !strcmp(extspec, oldextspec) ) )

                     /* filtering specs are given and are identical, and */
                     /* the same extension is specified */

                 {
                     if (mode == READWRITE && oldFptr->writemode == READONLY)
                     {
                       /*
                         cannot assume that a file previously opened with READONLY
                         can now be written to (e.g., files on CDROM, or over the
                         the network, or STDIN), so return with an error.
                       */

                       ffpmsg(
                   "cannot reopen file READWRITE when previously opened READONLY");
                       ffpmsg(url);
                       return(*status = FILE_NOT_OPENED);
                     }
                     iMatch = ii;

                  }
              }
          } /* end if old file recognizes extended syntax */
      } /* end if old fptr exists */
    } /* end loop over NMAXFILES */
    if (iMatch >= 0)
    {
       oldFptr = FptrTable[iMatch];
       *fptr = (fitsfile *) calloc(1, sizeof(fitsfile));

       if (!(*fptr))
       {
          ffpmsg(
        "failed to allocate structure for following file: (ffopen)");
          ffpmsg(url);
          return(*status = MEMORY_ALLOCATION);
       }

       (*fptr)->Fptr = oldFptr; /* point to the structure */
       (*fptr)->HDUposition = 0;     /* set initial position */
       (((*fptr)->Fptr)->open_count)++;  /* increment usage counter */

       if (binspec[0])  /* if binning specified, don't move */
           extspec[0] = '\0';

       /* all the filtering has already been applied, so ignore */
       rowfilter[0] = '\0';
       binspec[0] = '\0';
       colspec[0] = '\0';

       *isopen = 1;
    }
    return(*status);
}